

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

int enet_initialize_with_callbacks(ENetVersion version,ENetCallbacks *inits)

{
  ENetCallbacks *inits_local;
  ENetVersion version_local;
  
  if (version < 0x10300) {
    inits_local._4_4_ = -1;
  }
  else {
    if ((inits->malloc != (_func_void_ptr_size_t *)0x0) ||
       (inits->free != (_func_void_void_ptr *)0x0)) {
      if ((inits->malloc == (_func_void_ptr_size_t *)0x0) ||
         (inits->free == (_func_void_void_ptr *)0x0)) {
        return -1;
      }
      callbacks.malloc = inits->malloc;
      callbacks.free = inits->free;
    }
    if (inits->noMemory != (_func_void *)0x0) {
      callbacks.noMemory = inits->noMemory;
    }
    inits_local._4_4_ = enet_initialize();
  }
  return inits_local._4_4_;
}

Assistant:

int enet_initialize_with_callbacks(ENetVersion version, const ENetCallbacks* inits) {
	if (version < ENET_VERSION_CREATE(1, 3, 0)) {
		ENET_LOG_ERROR("ENet version is too old");
		return -1;
	}

	if (inits->malloc != NULL || inits->free != NULL) {
		if (inits->malloc == NULL || inits->free == NULL) {
			ENET_LOG_ERROR("Memory allocator/free mechanism is NULL");
			return -1;
		}

		callbacks.malloc = inits->malloc;
		callbacks.free = inits->free;
	}

	if (inits->noMemory != NULL)
		callbacks.noMemory = inits->noMemory;

	return enet_initialize();
}